

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# rayfork.c
# Opt level: O1

rf_gif * rf_load_animated_gif
                   (rf_gif *__return_storage_ptr__,void *data,rf_int data_size,
                   rf_allocator allocator,rf_allocator temp_allocator)

{
  rf_source_location rVar1;
  rf_source_location rVar2;
  rf_allocator_args rVar3;
  undefined1 auVar4 [24];
  undefined8 *puVar5;
  rf_gif *prVar6;
  ulong uVar7;
  int iVar8;
  stbi__context *psVar9;
  int *piVar10;
  void *pvVar11;
  void *pvVar12;
  long lVar13;
  stbi__context *s;
  int iVar14;
  rf_allocator_proc *two_back;
  uint new_size;
  uint old_size;
  uint uVar15;
  size_t __n;
  long *in_FS_OFFSET;
  int component_count;
  stbi__gif g;
  int local_8b64;
  undefined8 *local_8b60;
  rf_gif *local_8b58;
  void *local_8b50;
  ulong local_8b48;
  stbi_uc *local_8b40;
  ulong uStack_8b38;
  undefined4 local_8b30;
  char *local_8b28;
  char *pcStack_8b20;
  undefined8 local_8b18;
  ulong local_8b10;
  int local_8b04;
  long local_8b00;
  void *local_8af8;
  ulong local_8af0;
  stbi__context *local_8ae8;
  void *local_8ae0;
  undefined8 uStack_8ad8;
  undefined4 local_8ad0;
  uint uStack_8acc;
  char *local_8ac8;
  char *pcStack_8ac0;
  undefined8 local_8ab8;
  undefined8 local_8ab0;
  size_t sStack_8aa8;
  undefined4 local_8aa0;
  uint uStack_8a9c;
  char *local_8a98;
  char *pcStack_8a90;
  undefined8 local_8a88;
  stbi_uc *local_8a80;
  undefined8 uStack_8a78;
  undefined4 local_8a70;
  char *local_8a68;
  char *pcStack_8a60;
  undefined8 local_8a58;
  stbi_uc *local_8a50;
  undefined8 uStack_8a48;
  undefined4 local_8a40;
  char *local_8a38;
  char *pcStack_8a30;
  undefined8 local_8a28;
  stbi_uc *local_8a20;
  undefined8 uStack_8a18;
  undefined4 local_8a10;
  char *local_8a08;
  char *pcStack_8a00;
  undefined8 local_89f8;
  stbi_uc *local_89f0;
  undefined8 uStack_89e8;
  undefined4 local_89e0;
  char *local_89d8;
  char *pcStack_89d0;
  undefined8 local_89c8;
  stbi_uc *local_89c0;
  undefined8 uStack_89b8;
  undefined4 local_89b0;
  char *local_89a8;
  char *pcStack_89a0;
  undefined8 local_8998;
  rf_allocator local_8990;
  stbi__context local_8980;
  stbi__gif local_88a0;
  ulong uVar16;
  
  two_back = allocator.allocator_proc;
  local_8990.user_data = allocator.user_data;
  *(undefined8 *)((long)&__return_storage_ptr__->field_2 + 0x10) = 0;
  (__return_storage_ptr__->field_2).image.data = (void *)0x0;
  *(undefined8 *)((long)&__return_storage_ptr__->field_2 + 8) = 0;
  *(undefined8 *)__return_storage_ptr__ = 0;
  __return_storage_ptr__->frame_delays = (int *)0x0;
  local_8b60 = (undefined8 *)(*in_FS_OFFSET + -0x430);
  in_FS_OFFSET[-0x86] = (long)temp_allocator.user_data;
  in_FS_OFFSET[-0x85] = (long)temp_allocator.allocator_proc;
  local_8b64 = 0;
  local_8980.io.read = (_func_int_void_ptr_char_ptr_int *)0x0;
  local_8980.read_from_callbacks = 0;
  local_8980.callback_already_read = 0;
  local_8980.img_buffer_end = (stbi_uc *)((long)(int)data_size + (long)data);
  local_8990.allocator_proc = two_back;
  local_8980.img_buffer = (stbi_uc *)data;
  local_8980.img_buffer_original = (stbi_uc *)data;
  local_8980.img_buffer_original_end = local_8980.img_buffer_end;
  iVar8 = stbi__gif_test(&local_8980);
  local_8b58 = __return_storage_ptr__;
  if (iVar8 == 0) {
    in_FS_OFFSET[-0x81] = (long)"not GIF";
LAB_001324f9:
    pvVar11 = (void *)0x0;
  }
  else {
    memset(&local_88a0,0,0x8870);
    __return_storage_ptr__->frame_delays = (int *)0x0;
    local_8b50 = (void *)0x0;
    lVar13 = 0;
    local_8b48 = 0;
    old_size = 0;
    local_8b10 = 0;
    do {
      s = &local_8980;
      local_8b00 = lVar13;
      psVar9 = (stbi__context *)
               stbi__gif_load_next(s,&local_88a0,&local_8b64,(int)lVar13,(stbi_uc *)two_back);
      lVar13 = local_8b00;
      if (psVar9 != (stbi__context *)0x0 && psVar9 != s) {
        (__return_storage_ptr__->field_2).image.width = local_88a0.w;
        (__return_storage_ptr__->field_2).image.height = local_88a0.h;
        uVar15 = (int)local_8b48 + 1;
        uVar16 = (ulong)uVar15;
        iVar8 = local_88a0.h * local_88a0.w;
        local_8b04 = iVar8 * 4;
        new_size = local_8b04 * uVar15;
        local_8ae8 = psVar9;
        if (local_8b50 == (void *)0x0) {
          uStack_8b38 = (ulong)(int)new_size;
          local_8b28 = 
          "/workspace/llm4binary/github/license_c_cmakelists/SasLuca[P]rayfork-sokol-template/libs/rayfork/rayfork.c"
          ;
          pcStack_8b20 = "stbi__malloc";
          local_8b18 = 0x1325;
          local_8b40 = (stbi_uc *)0x0;
          local_8b30 = 0;
          pvVar11 = (void *)(*(code *)in_FS_OFFSET[-0x85])(local_8b60,1);
          uStack_8b38 = (long)(int)uVar15 << 2;
          local_8b28 = 
          "/workspace/llm4binary/github/license_c_cmakelists/SasLuca[P]rayfork-sokol-template/libs/rayfork/rayfork.c"
          ;
          pcStack_8b20 = "stbi__malloc";
          local_8b18 = 0x1325;
          local_8b40 = (stbi_uc *)0x0;
          local_8b30 = 0;
          local_8b10 = uStack_8b38;
          piVar10 = (int *)(*(code *)in_FS_OFFSET[-0x85])(local_8b60,1);
          __return_storage_ptr__->frame_delays = piVar10;
        }
        else {
          two_back = (rf_allocator_proc *)(ulong)new_size;
          pvVar12 = rf_realloc_wrapper(*(rf_allocator *)(in_FS_OFFSET + -0x86),local_8b50,old_size,
                                       new_size);
          prVar6 = local_8b58;
          puVar5 = local_8b60;
          local_8af0 = uVar16;
          if (pvVar12 == (void *)0x0) {
            local_89a8 = 
            "/workspace/llm4binary/github/license_c_cmakelists/SasLuca[P]rayfork-sokol-template/libs/rayfork/rayfork.c"
            ;
            pcStack_89a0 = "stbi__load_gif_main";
            local_8998 = 0x29f7;
            local_89c0 = local_88a0.out;
            uStack_89b8 = 0;
            local_89b0 = 0;
            local_8af8 = pvVar12;
            (*(code *)in_FS_OFFSET[-0x85])(local_8b60,3);
            local_89d8 = 
            "/workspace/llm4binary/github/license_c_cmakelists/SasLuca[P]rayfork-sokol-template/libs/rayfork/rayfork.c"
            ;
            pcStack_89d0 = "stbi__load_gif_main";
            local_89c8 = 0x29f8;
            local_89f0 = local_88a0.history;
            uStack_89e8 = 0;
            local_89e0 = 0;
            (*(code *)in_FS_OFFSET[-0x85])(puVar5,3);
            pvVar12 = local_8af8;
            local_8a08 = 
            "/workspace/llm4binary/github/license_c_cmakelists/SasLuca[P]rayfork-sokol-template/libs/rayfork/rayfork.c"
            ;
            pcStack_8a00 = "stbi__load_gif_main";
            local_89f8 = 0x29f9;
            local_8a20 = local_88a0.background;
            uStack_8a18 = 0;
            local_8a10 = 0;
            (*(code *)in_FS_OFFSET[-0x85])(puVar5,3);
            in_FS_OFFSET[-0x81] = (long)"outofmem";
            new_size = old_size;
          }
          else {
            uVar15 = uVar15 * 4;
            two_back = (rf_allocator_proc *)(ulong)uVar15;
            piVar10 = (int *)rf_realloc_wrapper(*(rf_allocator *)(in_FS_OFFSET + -0x86),
                                                local_8b58->frame_delays,(int)local_8b10,uVar15);
            prVar6->frame_delays = piVar10;
            local_8b10 = (ulong)uVar15;
            local_8b50 = pvVar12;
          }
          pvVar11 = local_8b50;
          uVar16 = local_8af0;
          __return_storage_ptr__ = local_8b58;
          if (pvVar12 == (void *)0x0) goto LAB_001324f9;
        }
        uVar7 = local_8b48;
        iVar14 = (int)local_8b48;
        memcpy((void *)((long)(local_8b04 * iVar14) + (long)pvVar11),local_8ae8,(long)local_8b04);
        lVar13 = local_8b00;
        if (0 < iVar14) {
          lVar13 = (long)pvVar11 - (long)(iVar8 * 8);
        }
        __return_storage_ptr__->frame_delays[uVar7 & 0xffffffff] = local_88a0.delay;
        local_8b48 = uVar16 & 0xffffffff;
        old_size = new_size;
        local_8b50 = pvVar11;
      }
      puVar5 = local_8b60;
    } while (psVar9 != (stbi__context *)0x0 && psVar9 != s);
    local_8b28 = 
    "/workspace/llm4binary/github/license_c_cmakelists/SasLuca[P]rayfork-sokol-template/libs/rayfork/rayfork.c"
    ;
    pcStack_8b20 = "stbi__load_gif_main";
    local_8b18 = 0x2a19;
    local_8b40 = local_88a0.out;
    uStack_8b38 = 0;
    local_8b30 = 0;
    (*(code *)in_FS_OFFSET[-0x85])(local_8b60,3);
    local_8a38 = 
    "/workspace/llm4binary/github/license_c_cmakelists/SasLuca[P]rayfork-sokol-template/libs/rayfork/rayfork.c"
    ;
    pcStack_8a30 = "stbi__load_gif_main";
    local_8a28 = 0x2a1a;
    local_8a50 = local_88a0.history;
    uStack_8a48 = 0;
    local_8a40 = 0;
    (*(code *)in_FS_OFFSET[-0x85])(puVar5,3);
    local_8a68 = 
    "/workspace/llm4binary/github/license_c_cmakelists/SasLuca[P]rayfork-sokol-template/libs/rayfork/rayfork.c"
    ;
    pcStack_8a60 = "stbi__load_gif_main";
    local_8a58 = 0x2a1b;
    local_8a80 = local_88a0.background;
    uStack_8a78 = 0;
    local_8a70 = 0;
    (*(code *)in_FS_OFFSET[-0x85])(puVar5,3);
    __return_storage_ptr__->frames_count = (int)local_8b48;
    pvVar11 = local_8b50;
  }
  if ((pvVar11 != (void *)0x0) && (local_8b64 == 4)) {
    local_8a98 = 
    "/workspace/llm4binary/github/license_c_cmakelists/SasLuca[P]rayfork-sokol-template/libs/rayfork/rayfork.c"
    ;
    pcStack_8a90 = "rf_load_animated_gif";
    local_8a88 = 0x4695;
    local_8ab0 = 0;
    __n = (size_t)((local_8b58->field_2).image.width * (local_8b58->field_2).image.height * 4);
    local_8aa0 = 0;
    rVar1.proc_name._0_4_ = 0x17d3d3;
    rVar1.file_name =
         "/workspace/llm4binary/github/license_c_cmakelists/SasLuca[P]rayfork-sokol-template/libs/rayfork/rayfork.c"
    ;
    rVar1.proc_name._4_4_ = 0;
    rVar1.line_in_file = 0x4695;
    auVar4._8_8_ = (ulong)uStack_8a9c << 0x20;
    auVar4._0_8_ = __n;
    auVar4._16_8_ = 0;
    sStack_8aa8 = __n;
    pvVar12 = (*local_8990.allocator_proc)
                        (&local_8990,rVar1,RF_AM_ALLOC,(rf_allocator_args)(auVar4 << 0x40));
    if (pvVar12 != (void *)0x0) {
      memcpy(pvVar12,pvVar11,__n);
      (local_8b58->field_2).image.data = pvVar12;
      (local_8b58->field_2).image.format = RF_UNCOMPRESSED_R8G8B8A8;
      (local_8b58->field_2).image.valid = true;
    }
  }
  local_8ac8 = 
  "/workspace/llm4binary/github/license_c_cmakelists/SasLuca[P]rayfork-sokol-template/libs/rayfork/rayfork.c"
  ;
  pcStack_8ac0 = "rf_load_animated_gif";
  local_8ab8 = 0x46a1;
  uStack_8ad8 = 0;
  local_8ad0 = 0;
  rVar2.proc_name._0_4_ = 0x17d3d3;
  rVar2.file_name =
       "/workspace/llm4binary/github/license_c_cmakelists/SasLuca[P]rayfork-sokol-template/libs/rayfork/rayfork.c"
  ;
  rVar2.proc_name._4_4_ = 0;
  rVar2.line_in_file = 0x46a1;
  rVar3.size_to_allocate_or_reallocate = 0;
  rVar3.pointer_to_free_or_realloc = pvVar11;
  rVar3._16_8_ = (ulong)uStack_8acc << 0x20;
  local_8ae0 = pvVar11;
  (*temp_allocator.allocator_proc)(&temp_allocator,rVar2,RF_AM_FREE,rVar3);
  *local_8b60 = 0;
  local_8b60[1] = 0;
  return local_8b58;
}

Assistant:

RF_API rf_gif rf_load_animated_gif(const void* data, rf_int data_size, rf_allocator allocator, rf_allocator temp_allocator)
{
    rf_gif gif = {0};

    RF_SET_GLOBAL_DEPENDENCIES_ALLOCATOR(temp_allocator);
    {
        int component_count = 0;
        void* loaded_gif = stbi_load_gif_from_memory(data, data_size, &gif.frame_delays, &gif.width, &gif.height, &gif.frames_count, &component_count, 4);

        if (loaded_gif && component_count == 4)
        {
            int loaded_gif_size = gif.width * gif.height * rf_bytes_per_pixel(RF_UNCOMPRESSED_R8G8B8A8);
            void* dst = RF_ALLOC(allocator, loaded_gif_size);

            if (dst)
            {
                memcpy(dst, loaded_gif, loaded_gif_size);

                gif.data   = dst;
                gif.format = RF_UNCOMPRESSED_R8G8B8A8;
                gif.valid  = true;
            }
        }

        RF_FREE(temp_allocator, loaded_gif);
    }
    RF_SET_GLOBAL_DEPENDENCIES_ALLOCATOR(RF_NULL_ALLOCATOR);

    return gif;
}